

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermOrderingDiagram.cpp
# Opt level: O2

void __thiscall Kernel::TermOrderingDiagram::processVarNode(TermOrderingDiagram *this)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  bool bVar4;
  Trace *this_00;
  Branch *other;
  Branch *this_01;
  Result val;
  Result local_5c;
  Branch local_58;
  Branch local_50;
  Branch local_48;
  Branch local_40;
  Branch local_38;
  Branch local_30;
  Branch local_28;
  
  pNVar1 = this->_curr->_node;
  this_00 = getCurrentTrace(this);
  bVar4 = TermPartialOrdering::get
                    (this_00,(TermList)(pNVar1->field_1).lhs._content,
                     (TermList)(pNVar1->field_2).rhs._content,&local_5c);
  if (bVar4) {
    if (local_5c == EQUAL) {
      other = &pNVar1->eqBranch;
      this_01 = &local_30;
    }
    else if (local_5c == GREATER) {
      other = &pNVar1->gtBranch;
      this_01 = &local_28;
    }
    else {
      other = &pNVar1->ngeBranch;
      this_01 = &local_38;
    }
    Branch::Branch(this_01,other);
    pNVar1 = this->_curr->_node;
    this->_curr->_node = this_01->_node;
    this_01->_node = pNVar1;
    Branch::~Branch(this_01);
  }
  else {
    if (1 < pNVar1->refcnt) {
      Branch::Branch(&local_40,(TermList)(pNVar1->field_1).lhs._content,
                     (TermList)(pNVar1->field_2).rhs._content);
      pNVar2 = this->_curr->_node;
      this->_curr->_node = local_40._node;
      local_40._node = pNVar2;
      Branch::~Branch(&local_40);
      Branch::Branch(&local_48,&pNVar1->eqBranch);
      pNVar2 = this->_curr->_node;
      pNVar3 = (pNVar2->eqBranch)._node;
      (pNVar2->eqBranch)._node = local_48._node;
      local_48._node = pNVar3;
      Branch::~Branch(&local_48);
      Branch::Branch(&local_50,&pNVar1->gtBranch);
      pNVar2 = this->_curr->_node;
      pNVar3 = (pNVar2->gtBranch)._node;
      (pNVar2->gtBranch)._node = local_50._node;
      local_50._node = pNVar3;
      Branch::~Branch(&local_50);
      Branch::Branch(&local_58,&pNVar1->ngeBranch);
      pNVar1 = this->_curr->_node;
      pNVar2 = (pNVar1->ngeBranch)._node;
      (pNVar1->ngeBranch)._node = local_58._node;
      local_58._node = pNVar2;
      Branch::~Branch(&local_58);
    }
    pNVar1 = this->_curr->_node;
    pNVar1->ready = true;
    pNVar1->trace = this_00;
  }
  return;
}

Assistant:

void TermOrderingDiagram::processVarNode()
{
  auto node = _curr->node();
  auto trace = getCurrentTrace();
  Ordering::Result val;
  if (trace->get(node->lhs, node->rhs, val)) {
    if (val == Ordering::GREATER) {
      *_curr = node->gtBranch;
    } else if (val == Ordering::EQUAL) {
      *_curr = node->eqBranch;
    } else {
      *_curr = node->ngeBranch;
    }
    return;
  }
  // if refcnt > 1 we have to copy the node,
  // otherwise we can mutate the original
  if (node->refcnt > 1) {
    *_curr = Branch(node->lhs, node->rhs);
    _curr->node()->eqBranch = node->eqBranch;
    _curr->node()->gtBranch = node->gtBranch;
    _curr->node()->ngeBranch = node->ngeBranch;
  }
  _curr->node()->ready = true;
  _curr->node()->trace = trace;
}